

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

void raviV_op_div(lua_State *L,TValue *ra,TValue *rb,TValue *rc)

{
  TValue *io;
  lua_Number lVar1;
  lua_Number lVar2;
  
  if (rb->tt_ == 0x13) {
    lVar1 = (lua_Number)(rb->value_).i;
  }
  else {
    if (rb->tt_ != 3) goto LAB_0012e109;
    lVar1 = (rb->value_).n;
  }
  if (rc->tt_ == 0x13) {
    lVar2 = (lua_Number)(rc->value_).i;
  }
  else {
    if (rc->tt_ != 3) {
LAB_0012e109:
      luaT_trybinTM(L,rb,rc,ra,TM_DIV);
      return;
    }
    lVar2 = (rc->value_).n;
  }
  (ra->value_).n = lVar1 / lVar2;
  ra->tt_ = 3;
  return;
}

Assistant:

void raviV_op_div(lua_State *L, TValue *ra, TValue *rb, TValue *rc) {
  lua_Number nb;
  lua_Number nc;
  if (tonumberns(rb, nb) && tonumberns(rc, nc)) {
    setfltvalue(ra, luai_numdiv(L, nb, nc));
  }
  else {
    luaT_trybinTM(L, rb, rc, ra, TM_DIV);
  }
}